

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

LogLevel cmake::StringToLogLevel(string *levelStr)

{
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>
  __l;
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  LogLevel local_1f4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
  *local_1c8;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>_>
  local_1b8;
  string *local_1b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
  *local_1a8;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>_>
  local_1a0;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>_>
  local_198;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>_>
  it;
  string levelStrLowCase;
  LogLevel local_168 [9];
  LogLevel local_144;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
  *local_140;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
  local_138;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
  local_110;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
  local_e8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
  local_c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
  local_98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
  local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
  local_48;
  iterator local_20;
  size_type local_18;
  undefined1 local_10 [8];
  string *levelStr_local;
  
  local_10 = (undefined1  [8])levelStr;
  if (StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_);
    if (iVar2 != 0) {
      local_140 = &local_138;
      local_144 = LOG_ERROR;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
      ::pair<const_char_(&)[6],_cmake::LogLevel,_true>(local_140,(char (*) [6])0x8d05f6,&local_144);
      local_140 = &local_110;
      local_168[4] = 2;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
      ::pair<const_char_(&)[8],_cmake::LogLevel,_true>
                (local_140,(char (*) [8])0x89d727,local_168 + 4);
      local_140 = &local_e8;
      local_168[3] = 3;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
      ::pair<const_char_(&)[7],_cmake::LogLevel,_true>
                (local_140,(char (*) [7])"notice",local_168 + 3);
      local_140 = &local_c0;
      local_168[2] = 4;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
      ::pair<const_char_(&)[7],_cmake::LogLevel,_true>
                (local_140,(char (*) [7])0x8cdde8,local_168 + 2);
      local_140 = &local_98;
      local_168[1] = 5;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
      ::pair<const_char_(&)[8],_cmake::LogLevel,_true>
                (local_140,(char (*) [8])"verbose",local_168 + 1);
      local_140 = &local_70;
      local_168[0] = LOG_DEBUG;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
      ::pair<const_char_(&)[6],_cmake::LogLevel,_true>(local_140,(char (*) [6])"debug",local_168);
      local_140 = &local_48;
      levelStrLowCase.field_2._12_4_ = 7;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
      ::pair<const_char_(&)[6],_cmake::LogLevel,_true>
                (local_140,(char (*) [6])0x89f20a,
                 (LogLevel *)(levelStrLowCase.field_2._M_local_buf + 0xc));
      local_20 = &local_138;
      local_18 = 7;
      std::
      allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>
      ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>
                   *)(levelStrLowCase.field_2._M_local_buf + 0xb));
      __l._M_len = local_18;
      __l._M_array = local_20;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>
      ::vector(&StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_,__l,
               (allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>
                *)(levelStrLowCase.field_2._M_local_buf + 0xb));
      std::
      allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>
      ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>
                    *)(levelStrLowCase.field_2._M_local_buf + 0xb));
      local_1c8 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
                   *)&local_20;
      do {
        local_1c8 = local_1c8 + -1;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
        ::~pair(local_1c8);
      } while (local_1c8 != &local_138);
      __cxa_atexit(std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>
                   ::~vector,&StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_);
    }
  }
  cmsys::SystemTools::LowerCase((string *)&it,(string *)local_10);
  local_1a0._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
        *)std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>
          ::cbegin(&StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_);
  local_1a8 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
               *)std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>
                 ::cend(&StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_);
  local_1b0 = (string *)&it;
  local_198 = std::
              find_if<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,cmake::LogLevel>const*,std::vector<std::pair<std::__cxx11::string,cmake::LogLevel>,std::allocator<std::pair<std::__cxx11::string,cmake::LogLevel>>>>,cmake::StringToLogLevel(std::__cxx11::string_const&)::__0>
                        (local_1a0,
                         (__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>_>
                          )local_1a8,(string *)&it);
  local_1b8._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>
        *)std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>
          ::cend(&StringToLogLevel(std::__cxx11::string_const&)::levels_abi_cxx11_);
  bVar1 = __gnu_cxx::operator!=(&local_198,&local_1b8);
  if (bVar1) {
    ppVar3 = __gnu_cxx::
             __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::LogLevel>_>_>_>
             ::operator->(&local_198);
    local_1f4 = ppVar3->second;
  }
  else {
    local_1f4 = LOG_UNDEFINED;
  }
  std::__cxx11::string::~string((string *)&it);
  return local_1f4;
}

Assistant:

cmake::LogLevel cmake::StringToLogLevel(const std::string& levelStr)
{
  using LevelsPair = std::pair<std::string, LogLevel>;
  static const std::vector<LevelsPair> levels = {
    { "error", LogLevel::LOG_ERROR },     { "warning", LogLevel::LOG_WARNING },
    { "notice", LogLevel::LOG_NOTICE },   { "status", LogLevel::LOG_STATUS },
    { "verbose", LogLevel::LOG_VERBOSE }, { "debug", LogLevel::LOG_DEBUG },
    { "trace", LogLevel::LOG_TRACE }
  };

  const auto levelStrLowCase = cmSystemTools::LowerCase(levelStr);

  const auto it = std::find_if(levels.cbegin(), levels.cend(),
                               [&levelStrLowCase](const LevelsPair& p) {
                                 return p.first == levelStrLowCase;
                               });
  return (it != levels.cend()) ? it->second : LogLevel::LOG_UNDEFINED;
}